

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadratic_roundtrip_test.cxx
# Opt level: O0

void quadratic_roundtrip_endec_test<cryptox::symmetric_algorithm<&EVP_des_ede3_ecb>>(size_t rounds)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  int local_9c;
  undefined1 local_98 [4];
  int i;
  endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_ede3_ecb>_> endec;
  size_t rounds_local;
  
  endec.decryptor.
  super_basic_endec<cryptox::symmetric_algorithm<&EVP_des_ede3_ecb>,_&EVP_DecryptInit_ex,_&EVP_DecryptUpdate,_&EVP_DecryptFinal_ex>
  .
  super_evp_cipher_context<cryptox::symmetric_algorithm<&EVP_des_ede3_ecb>,_&EVP_DecryptInit_ex,_&EVP_DecryptUpdate,_&EVP_DecryptFinal_ex>
  ._total_output = rounds;
  cryptox::tests::endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_ede3_ecb>_>::
  endec_pair_tester((endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_ede3_ecb>_> *)local_98)
  ;
  for (local_9c = 0;
      (ulong)(long)local_9c <=
      endec.decryptor.
      super_basic_endec<cryptox::symmetric_algorithm<&EVP_des_ede3_ecb>,_&EVP_DecryptInit_ex,_&EVP_DecryptUpdate,_&EVP_DecryptFinal_ex>
      .
      super_evp_cipher_context<cryptox::symmetric_algorithm<&EVP_des_ede3_ecb>,_&EVP_DecryptInit_ex,_&EVP_DecryptUpdate,_&EVP_DecryptFinal_ex>
      ._total_output; local_9c = local_9c + 1) {
    cryptox::detail::make_random_vector(&local_b8,(long)local_9c);
    cryptox::tests::endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_ede3_ecb>>::
    check_roundtrip<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_ede3_ecb>> *)local_98,
               &local_b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_b8);
  }
  cryptox::tests::endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_ede3_ecb>_>::
  ~endec_pair_tester((endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_ede3_ecb>_> *)local_98
                    );
  return;
}

Assistant:

void quadratic_roundtrip_endec_test(const size_t rounds = 4096) {
	cryptox::tests::endec_pair_tester<Algorithm> endec;

	for (int i=0; i<=rounds; ++i) {
		using cryptox::detail::make_random_vector;
		endec.check_roundtrip(make_random_vector(i));
	}
}